

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ontrak.cpp
# Opt level: O2

int GetDeviceCurrentState(char *szFilename,int *pbON)

{
  int iVar1;
  FILE *__stream;
  char *__s;
  
  *pbON = 0;
  __stream = fopen(szFilename,"r");
  if (__stream == (FILE *)0x0) {
    __s = "Device current state file not found.";
  }
  else {
    iVar1 = __isoc99_fscanf(__stream,"%d",pbON);
    if (iVar1 != 1) {
      mSleep(0x4b);
      rewind(__stream);
      iVar1 = __isoc99_fscanf(__stream,"%d",pbON);
      if (iVar1 != 1) {
        puts("Error reading device current state file.");
        *pbON = 0;
        fclose(__stream);
        return 1;
      }
    }
    iVar1 = fclose(__stream);
    if (iVar1 == 0) {
      return 0;
    }
    __s = "Error closing device current state file.";
  }
  puts(__s);
  return 1;
}

Assistant:

int GetDeviceCurrentState(char* szFilename, int* pbON)
{

	// Should use an interprocess semaphore...

	FILE* file = NULL;

	*pbON = 0;

	file = fopen(szFilename, "r");
	if (file == NULL)
	{
		printf("Device current state file not found.\n");
		return EXIT_FAILURE;
	}
	if (fscanf(file, "%d", pbON) != 1)
	{
		// Wait and retry in case the file was being modified.
		mSleep(75);
		rewind(file);
		if (fscanf(file, "%d", pbON) != 1)
		{
			printf("Error reading device current state file.\n");
			*pbON = 0;
			fclose(file);
			return EXIT_FAILURE;
		}
	}
	if (fclose(file) != EXIT_SUCCESS)
	{
		printf("Error closing device current state file.\n");
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}